

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

uint32_t arm_debug_exception_fsr(CPUARMState_conflict *env)

{
  bool bVar1;
  _Bool _Var2;
  int el;
  int iVar3;
  undefined1 auStack_38 [3];
  _Bool using_lpae;
  int target_el;
  ARMMMUFaultInfo_conflict1 fi;
  CPUARMState_conflict *env_local;
  
  _auStack_38 = ARMFault_Debug;
  target_el = 0;
  fi.type = ARMFault_None;
  fi._4_4_ = 0;
  fi.s2addr = 0;
  fi.level = 0;
  fi.domain = 0;
  fi._24_8_ = env;
  el = arm_debug_target_el(env);
  bVar1 = false;
  if ((el == 2) || (_Var2 = arm_el_is_aa64((CPUARMState_conflict *)fi._24_8_,el), _Var2)) {
    bVar1 = true;
  }
  else {
    iVar3 = arm_feature((CPUARMState_conflict *)fi._24_8_,0x1a);
    if ((iVar3 != 0) && ((*(ulong *)(fi._24_8_ + 0x348 + (long)el * 0x10) & 0x80000000) != 0)) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    env_local._4_4_ = arm_fi_to_lfsc((ARMMMUFaultInfo_conflict1 *)auStack_38);
  }
  else {
    env_local._4_4_ = arm_fi_to_sfsc((ARMMMUFaultInfo_conflict1 *)auStack_38);
  }
  return env_local._4_4_;
}

Assistant:

static inline uint32_t arm_debug_exception_fsr(CPUARMState *env)
{
    ARMMMUFaultInfo fi = { .type = ARMFault_Debug };
    int target_el = arm_debug_target_el(env);
    bool using_lpae = false;

    if (target_el == 2 || arm_el_is_aa64(env, target_el)) {
        using_lpae = true;
    } else {
        if (arm_feature(env, ARM_FEATURE_LPAE) &&
            (env->cp15.tcr_el[target_el].raw_tcr & TTBCR_EAE)) {
            using_lpae = true;
        }
    }

    if (using_lpae) {
        return arm_fi_to_lfsc(&fi);
    } else {
        return arm_fi_to_sfsc(&fi);
    }
}